

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

bool __thiscall cmInstalledFile::GetProperty(cmInstalledFile *this,string *prop,string *value)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> *ve
  ;
  _Base_ptr p_Var4;
  string output;
  string separator;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
          ::find(&(this->Properties)._M_t,prop);
  p_Var3 = &(this->Properties)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    local_70 = local_60;
    local_68 = 0;
    local_50 = local_40;
    local_48 = 0;
    local_60[0] = 0;
    local_40[0] = 0;
    p_Var1 = cVar2._M_node[2]._M_parent;
    for (p_Var4 = *(_Base_ptr *)(cVar2._M_node + 2); p_Var4 != p_Var1;
        p_Var4 = (_Base_ptr)&p_Var4->_M_parent) {
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::assign((char *)&local_50);
    }
    std::__cxx11::string::_M_assign((string *)value);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return (_Rb_tree_header *)cVar2._M_node != p_Var3;
}

Assistant:

bool cmInstalledFile::GetProperty(const std::string& prop,
                                  std::string& value) const
{
  auto i = this->Properties.find(prop);
  if (i == this->Properties.end()) {
    return false;
  }

  Property const& property = i->second;

  std::string output;
  std::string separator;

  for (const auto& ve : property.ValueExpressions) {
    output += separator;
    output += ve->GetInput();
    separator = ";";
  }

  value = output;
  return true;
}